

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
InstallPrefixNode::Evaluate
          (string *__return_storage_ptr__,InstallPrefixNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  allocator local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_1_local;
  InstallPrefixNode *this_local;
  
  local_38 = param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)param_1;
  param_1_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (InstallPrefixNode *)__return_storage_ptr__;
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_58,content);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,
             "INSTALL_PREFIX is a marker for install(EXPORT) only.  It should never be evaluated.",
             &local_79);
  reportError(context,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *) const
  {
    reportError(context, content->GetOriginalExpression(),
                "INSTALL_PREFIX is a marker for install(EXPORT) only.  It "
                "should never be evaluated.");
    return std::string();
  }